

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_end(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x492f,"void nk_end(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
      pnVar1 = ctx->current->layout;
      if ((pnVar1 == (nk_panel *)0x0) ||
         ((pnVar1->type == NK_PANEL_WINDOW && ((ctx->current->flags & 0x2000) != 0)))) {
        ctx->current = (nk_window *)0x0;
      }
      else {
        nk_panel_end(ctx);
        nk_free_panel(ctx,ctx->current->layout);
        ctx->current = (nk_window *)0x0;
      }
    }
    return;
  }
  __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4930,"void nk_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}